

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::TransfersSrcValue(Instr *this)

{
  bool bVar1;
  Opnd *pOVar2;
  byte local_11;
  Instr *this_local;
  
  pOVar2 = GetDst(this);
  local_11 = 0;
  if (pOVar2 != (Opnd *)0x0) {
    pOVar2 = GetSrc2(this);
    if (pOVar2 != (Opnd *)0x0) {
      bVar1 = OpCodeAttr::NonIntTransfer(this->m_opcode);
      local_11 = 0;
      if (!bVar1) goto LAB_0062b45c;
    }
    bVar1 = OpCodeAttr::DoNotTransfer(this->m_opcode);
    local_11 = 0;
    if (!bVar1) {
      bVar1 = CallsAccessor(this,(PropertySymOpnd *)0x0);
      local_11 = bVar1 ^ 0xff;
    }
  }
LAB_0062b45c:
  return (bool)(local_11 & 1);
}

Assistant:

bool Instr::TransfersSrcValue()
{
    // Return whether the instruction transfers a value to the destination.
    // This is used to determine whether we should generate a value for the src so that it will
    // match with the dst for copy prop.

    // No point creating an unknown value for the src of a binary instr, as the dst will just be a different
    // Don't create value for instruction without dst as well. The value doesn't go anywhere.

    // Consider: Add opcode attribute to indicate whether the opcode would use the value or not

    return
        this->GetDst() != nullptr &&

        // The lack of a Src2 does not always indicate that the instr is not a transfer instr (ex: StSlotChkUndecl).
        (this->GetSrc2() == nullptr || OpCodeAttr::NonIntTransfer(this->m_opcode)) &&

        !OpCodeAttr::DoNotTransfer(this->m_opcode) &&
        !this->CallsAccessor();
}